

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int get8(stbi *s)

{
  byte *pbVar1;
  long in_RDI;
  int c;
  uint local_18;
  uint local_4;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    if (*(ulong *)(in_RDI + 0x18) < *(ulong *)(in_RDI + 0x20)) {
      pbVar1 = *(byte **)(in_RDI + 0x18);
      *(byte **)(in_RDI + 0x18) = pbVar1 + 1;
      local_4 = (uint)*pbVar1;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_18 = fgetc(*(FILE **)(in_RDI + 0x10));
    if (local_18 == 0xffffffff) {
      local_18 = 0;
    }
    local_4 = local_18;
  }
  return local_4;
}

Assistant:

__forceinline static int get8(stbi *s)
{
#ifndef STBI_NO_STDIO
   if (s->img_file) {
      int c = fgetc(s->img_file);
      return c == EOF ? 0 : c;
   }
#endif
   if (s->img_buffer < s->img_buffer_end)
      return *s->img_buffer++;
   return 0;
}